

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::RoundLog2(int x,int tile_rounding_mode)

{
  int in_ESI;
  uint in_EDI;
  undefined4 local_c;
  
  if (in_ESI == 0) {
    local_c = FloorLog2(in_EDI);
  }
  else {
    local_c = CeilLog2(in_EDI);
  }
  return local_c;
}

Assistant:

static int RoundLog2(int x, int tile_rounding_mode) {
  return (tile_rounding_mode == TINYEXR_TILE_ROUND_DOWN) ? FloorLog2(static_cast<unsigned>(x)) : CeilLog2(static_cast<unsigned>(x));
}